

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O1

void __thiscall PDA::toDot(PDA *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  State *pSVar3;
  pointer pcVar4;
  bool bVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  size_type *psVar10;
  pointer ppTVar11;
  pointer ppSVar12;
  ulong uVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  string connectionString;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  ulong *local_3a0;
  long local_398;
  ulong local_390;
  undefined4 uStack_388;
  undefined4 uStack_384;
  ulong *local_380;
  long local_378;
  ulong local_370 [2];
  long *local_360;
  long local_358;
  long local_350;
  long lStack_348;
  string local_340;
  string *local_320;
  string local_318;
  string local_2f8;
  Graph local_2d8;
  Connection local_288;
  Node local_228;
  Node local_1a8;
  Connection local_128;
  Node local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_2d8.rankdir._M_dataplus._M_p = (pointer)&local_2d8.rankdir.field_2;
  local_2d8.rankdir.field_2._8_8_ = 0;
  local_2d8.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2d8.connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2d8.nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2d8.rankdir._M_string_length = 0;
  local_2d8.rankdir.field_2._M_allocated_capacity = 0;
  ppSVar12 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_320 = filename;
  if (ppSVar12 !=
      (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_420.field_2;
    do {
      pSVar3 = *ppSVar12;
      bVar5 = isEndState(this,pSVar3);
      local_420._M_dataplus._M_p = (pointer)paVar1;
      if (bVar5) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"doublecircle","");
        Node::Node(&local_1a8,&pSVar3->name,&pSVar3->name,&local_420);
        Graph::addNode(&local_2d8,&local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.extra._M_dataplus._M_p != &local_1a8.extra.field_2) {
          operator_delete(local_1a8.extra._M_dataplus._M_p,
                          local_1a8.extra.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.shape._M_dataplus._M_p != &local_1a8.shape.field_2) {
          operator_delete(local_1a8.shape._M_dataplus._M_p,
                          local_1a8.shape.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.label._M_dataplus._M_p != &local_1a8.label.field_2) {
          operator_delete(local_1a8.label._M_dataplus._M_p,
                          local_1a8.label.field_2._M_allocated_capacity + 1);
        }
        uVar14 = local_1a8.name.field_2._M_allocated_capacity;
        _Var15._M_p = local_1a8.name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.name._M_dataplus._M_p != &local_1a8.name.field_2) {
LAB_0011c3c4:
          operator_delete(_Var15._M_p,uVar14 + 1);
        }
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"circle","");
        Node::Node(&local_228,&pSVar3->name,&pSVar3->name,&local_420);
        Graph::addNode(&local_2d8,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.extra._M_dataplus._M_p != &local_228.extra.field_2) {
          operator_delete(local_228.extra._M_dataplus._M_p,
                          local_228.extra.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.shape._M_dataplus._M_p != &local_228.shape.field_2) {
          operator_delete(local_228.shape._M_dataplus._M_p,
                          local_228.shape.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.label._M_dataplus._M_p != &local_228.label.field_2) {
          operator_delete(local_228.label._M_dataplus._M_p,
                          local_228.label.field_2._M_allocated_capacity + 1);
        }
        uVar14 = local_228.name.field_2._M_allocated_capacity;
        _Var15._M_p = local_228.name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.name._M_dataplus._M_p != &local_228.name.field_2) goto LAB_0011c3c4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != paVar1) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      ppSVar12 = ppSVar12 + 1;
    } while (ppSVar12 !=
             (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppTVar11 = (this->transitionFunctionD).
             super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppTVar11 !=
      (this->transitionFunctionD).super__Vector_base<Transition_*,_std::allocator<Transition_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_3c0.field_2;
    do {
      toString_abi_cxx11_(&local_2f8,(*ppTVar11)->input);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x1404fe);
      local_360 = &local_350;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_350 = *plVar8;
        lStack_348 = plVar6[3];
      }
      else {
        local_350 = *plVar8;
        local_360 = (long *)*plVar6;
      }
      local_358 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_360);
      local_3a0 = &local_390;
      puVar9 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar9) {
        local_390 = *puVar9;
        uStack_388 = (undefined4)plVar6[3];
        uStack_384 = *(undefined4 *)((long)plVar6 + 0x1c);
      }
      else {
        local_390 = *puVar9;
        local_3a0 = (ulong *)*plVar6;
      }
      local_398 = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_380 = local_370;
      pcVar4 = ((*ppTVar11)->stackInput)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_380,pcVar4,pcVar4 + ((*ppTVar11)->stackInput)._M_string_length);
      uVar13 = 0xf;
      if (local_3a0 != &local_390) {
        uVar13 = local_390;
      }
      if (uVar13 < (ulong)(local_378 + local_398)) {
        uVar13 = 0xf;
        if (local_380 != local_370) {
          uVar13 = local_370[0];
        }
        if (uVar13 < (ulong)(local_378 + local_398)) goto LAB_0011c58d;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_380,0,(char *)0x0,(ulong)local_3a0);
      }
      else {
LAB_0011c58d:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_380);
      }
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
      psVar10 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_3e0.field_2._M_allocated_capacity = *psVar10;
        local_3e0.field_2._8_8_ = puVar7[3];
      }
      else {
        local_3e0.field_2._M_allocated_capacity = *psVar10;
        local_3e0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_3e0._M_string_length = puVar7[1];
      *puVar7 = psVar10;
      puVar7[1] = 0;
      *(undefined1 *)psVar10 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_3e0);
      puVar9 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_3c0.field_2._M_allocated_capacity = *puVar9;
        local_3c0.field_2._8_8_ = plVar6[3];
        local_3c0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3c0.field_2._M_allocated_capacity = *puVar9;
        local_3c0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_3c0._M_string_length = plVar6[1];
      *plVar6 = (long)puVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,&(*ppTVar11)->stackPush);
      toString(&local_340,&local_48);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        uVar14 = local_3c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_340._M_string_length + local_3c0._M_string_length) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          uVar14 = local_340.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_340._M_string_length + local_3c0._M_string_length)
        goto LAB_0011c6bd;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_340,0,(char *)0x0,(ulong)local_3c0._M_dataplus._M_p);
      }
      else {
LAB_0011c6bd:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_3c0,(ulong)local_340._M_dataplus._M_p);
      }
      local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
      psVar10 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_400.field_2._M_allocated_capacity = *psVar10;
        local_400.field_2._8_8_ = puVar7[3];
      }
      else {
        local_400.field_2._M_allocated_capacity = *psVar10;
        local_400._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_400._M_string_length = puVar7[1];
      *puVar7 = psVar10;
      puVar7[1] = 0;
      *(undefined1 *)psVar10 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_400);
      local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_420.field_2._M_allocated_capacity = *psVar10;
        local_420.field_2._8_8_ = plVar6[3];
      }
      else {
        local_420.field_2._M_allocated_capacity = *psVar10;
        local_420._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_420._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != &local_400.field_2) {
        operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if (local_380 != local_370) {
        operator_delete(local_380,local_370[0] + 1);
      }
      if (local_3a0 != &local_390) {
        operator_delete(local_3a0,local_390 + 1);
      }
      if (local_360 != &local_350) {
        operator_delete(local_360,local_350 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      Connection::Connection
                (&local_288,&(*ppTVar11)->stateFrom->name,&(*ppTVar11)->stateTo->name,&local_420);
      Graph::addConnection(&local_2d8,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.label._M_dataplus._M_p != &local_288.label.field_2) {
        operator_delete(local_288.label._M_dataplus._M_p,
                        local_288.label.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.name_to._M_dataplus._M_p != &local_288.name_to.field_2) {
        operator_delete(local_288.name_to._M_dataplus._M_p,
                        local_288.name_to.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288.name_from._M_dataplus._M_p != &local_288.name_from.field_2) {
        operator_delete(local_288.name_from._M_dataplus._M_p,
                        local_288.name_from.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      ppTVar11 = ppTVar11 + 1;
    } while (ppTVar11 !=
             (this->transitionFunctionD).
             super__Vector_base<Transition_*,_std::allocator<Transition_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  paVar1 = &local_420.field_2;
  local_420._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"invis","");
  paVar2 = &local_400.field_2;
  local_400._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"invis","");
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"circle","");
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"style=invis","");
  Node::Node(&local_c8,&local_420,&local_400,&local_3c0,&local_3e0);
  Graph::addNode(&local_2d8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.extra._M_dataplus._M_p != &local_c8.extra.field_2) {
    operator_delete(local_c8.extra._M_dataplus._M_p,local_c8.extra.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.shape._M_dataplus._M_p != &local_c8.shape.field_2) {
    operator_delete(local_c8.shape._M_dataplus._M_p,local_c8.shape.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.label._M_dataplus._M_p != &local_c8.label.field_2) {
    operator_delete(local_c8.label._M_dataplus._M_p,local_c8.label.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.name._M_dataplus._M_p != &local_c8.name.field_2) {
    operator_delete(local_c8.name._M_dataplus._M_p,local_c8.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != paVar2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != paVar1) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  local_420._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"invis","");
  pSVar3 = this->startState;
  local_400._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"Start","");
  Connection::Connection(&local_128,&local_420,&pSVar3->name,&local_400);
  Graph::addConnection(&local_2d8,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.label._M_dataplus._M_p != &local_128.label.field_2) {
    operator_delete(local_128.label._M_dataplus._M_p,
                    local_128.label.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.name_to._M_dataplus._M_p != &local_128.name_to.field_2) {
    operator_delete(local_128.name_to._M_dataplus._M_p,
                    local_128.name_to.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.name_from._M_dataplus._M_p != &local_128.name_from.field_2) {
    operator_delete(local_128.name_from._M_dataplus._M_p,
                    local_128.name_from.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != paVar2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != paVar1) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (local_320->_M_dataplus)._M_p;
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_318,pcVar4,pcVar4 + local_320->_M_string_length);
  Graph::build_file(&local_2d8,&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.rankdir._M_dataplus._M_p != &local_2d8.rankdir.field_2) {
    operator_delete(local_2d8.rankdir._M_dataplus._M_p,
                    local_2d8.rankdir.field_2._M_allocated_capacity + 1);
  }
  std::vector<Connection,_std::allocator<Connection>_>::~vector(&local_2d8.connections);
  std::vector<Node,_std::allocator<Node>_>::~vector(&local_2d8.nodes);
  return;
}

Assistant:

void PDA::toDot(std::string filename) {
    Graph graph = Graph();
    for (vector<State *>::iterator state = statesQ.begin(); state != statesQ.end(); ++state) {
        if (isEndState(*state)) {
            graph.addNode(Node((*state)->getName(), (*state)->getName(), "doublecircle"));
        } else {
            graph.addNode(Node((*state)->getName(), (*state)->getName(), "circle"));
        }
    }

    for (vector<Transition *>::iterator connection = transitionFunctionD.begin();
         connection != transitionFunctionD.end(); ++connection) {
        std::string connectionString =
                "\"(" + toString((*connection)->getInput()) + ", " + (*connection)->getStackInput() +
                "/" +
                toString((*connection)->getStackPush()) + ")\"";
        graph.addConnection(Connection((*connection)->getStateFrom()->getName(), (*connection)->getStateTo()->getName(),
                                       connectionString));
    }

    graph.addNode(Node("invis", "invis", "circle", "style=invis"));
    graph.addConnection(Connection("invis", startState->getName(), "Start"));
    graph.build_file(filename);
}